

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_slots_get_prop(MppBufSlots slots,SlotsPropType type,void *val)

{
  MppFrame info;
  MppFrame frame;
  undefined1 local_40 [4];
  MPP_RET ret;
  AutoMutex auto_lock;
  MppBufSlotsImpl *impl;
  void *val_local;
  SlotsPropType type_local;
  MppBufSlots slots_local;
  
  if (((slots == (MppBufSlots)0x0) || (val == (void *)0x0)) || (0xb < (int)type)) {
    _mpp_log_l(2,"mpp_buf_slot","found invalid input slots %p type %d val %p\n","mpp_slots_get_prop"
               ,slots,(ulong)type,val);
    slots_local._4_4_ = MPP_NOK;
  }
  else {
    auto_lock.mLock = (Mutex *)slots;
    Mutex::Autolock::Autolock((Autolock *)local_40,*slots,1);
    frame._4_4_ = MPP_OK;
    switch(type) {
    case SLOTS_EOS:
      *(undefined4 *)val = *(undefined4 *)((long)&(auto_lock.mLock)->mMutex + 0x24);
      break;
    default:
      _mpp_log_l(2,"mpp_buf_slot","can not get slots prop type %d\n",(char *)0x0,(ulong)type);
      frame._4_4_ = MPP_NOK;
      break;
    case SLOTS_COUNT:
      *(int *)val = auto_lock.mLock[2].mMutex.__data.__kind;
      break;
    case SLOTS_SIZE:
      *(int *)val = (int)*(undefined8 *)((long)&auto_lock.mLock[2].mMutex + 8);
      break;
    case SLOTS_FRAME_INFO:
      mpp_frame_copy(val,auto_lock.mLock[3].mMutex.__data.__list.__prev);
    }
    slots_local._4_4_ = frame._4_4_;
    Mutex::Autolock::~Autolock((Autolock *)local_40);
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_slots_get_prop(MppBufSlots slots, SlotsPropType type, void *val)
{
    if (NULL == slots || NULL == val || type >= SLOTS_PROP_BUTT) {
        mpp_err_f("found invalid input slots %p type %d val %p\n", slots, type, val);
        return MPP_NOK;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    MPP_RET ret = MPP_OK;

    switch (type) {
    case SLOTS_EOS: {
        *((RK_U32 *)val) = impl->eos;
    } break;
    case SLOTS_COUNT: {
        *((RK_U32 *)val) = impl->buf_count;
    } break;
    case SLOTS_SIZE: {
        *((RK_U32 *)val) = (RK_U32)impl->buf_size;
    } break;
    case SLOTS_FRAME_INFO: {
        MppFrame frame = (MppFrame)val;
        MppFrame info  = impl->info;
        mpp_frame_copy(frame, info);
    } break;
    default : {
        mpp_err("can not get slots prop type %d\n", type);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}